

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::RunCMakeAndTest(cmCTest *this,string *output)

{
  char *pcVar1;
  int iVar2;
  cmCTestBuildAndTestHandler *this_00;
  char *__s;
  long *plVar3;
  ostringstream cmCTestLog_msg;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  this->Verbose = true;
  this_00 = (cmCTestBuildAndTestHandler *)GetHandler(this,"buildtest");
  iVar2 = (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])(this_00);
  __s = cmCTestBuildAndTestHandler::GetOutput(this_00);
  pcVar1 = (char *)output->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)output,0,pcVar1,(ulong)__s);
  cmDynamicLoader::FlushCache();
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"build and test failing returning: ",0x22);
    plVar3 = (long *)std::ostream::operator<<(local_1a0,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8d4,(char *)local_1c0,false);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return iVar2;
}

Assistant:

int cmCTest::RunCMakeAndTest(std::string* output)
{
  this->Verbose = true;
  cmCTestBuildAndTestHandler* handler =
    static_cast<cmCTestBuildAndTestHandler*>(this->GetHandler("buildtest"));
  int retv = handler->ProcessHandler();
  *output = handler->GetOutput();
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  if (retv != 0) {
    cmCTestLog(this, DEBUG, "build and test failing returning: " << retv
                                                                 << std::endl);
  }
  return retv;
}